

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node * __thiscall
QHashPrivate::Data<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node>::
findNode<unsigned_long_long>
          (Data<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node> *this,
          unsigned_long_long *key)

{
  long lVar1;
  bool bVar2;
  Node *pNVar3;
  unsigned_long_long *in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<unsigned_long_long>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Bucket::isUnused((Bucket *)0x1a1cdb);
  if (bVar2) {
    pNVar3 = (Node *)0x0;
  }
  else {
    pNVar3 = Bucket::node((Bucket *)0x1a1cf6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }